

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O0

BinaryenLiteral * BinaryenLiteralFloat64Bits(BinaryenLiteral *__return_storage_ptr__,int64_t x)

{
  Literal local_40;
  Literal local_28;
  int64_t local_10;
  int64_t x_local;
  
  local_10 = x;
  wasm::Literal::Literal(&local_40,x);
  wasm::Literal::castToF64(&local_28,&local_40);
  toBinaryenLiteral(__return_storage_ptr__,&local_28);
  wasm::Literal::~Literal(&local_28);
  wasm::Literal::~Literal(&local_40);
  return __return_storage_ptr__;
}

Assistant:

BinaryenLiteral BinaryenLiteralFloat64Bits(int64_t x) {
  return toBinaryenLiteral(Literal(x).castToF64());
}